

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O0

xmlDocPtr xmlCtxtReadDoc(xmlParserCtxtPtr ctxt,xmlChar *str,char *URL,char *encoding,int options)

{
  xmlParserInputPtr input_00;
  xmlParserInputPtr input;
  int options_local;
  char *encoding_local;
  char *URL_local;
  xmlChar *str_local;
  xmlParserCtxtPtr ctxt_local;
  
  if (ctxt == (xmlParserCtxtPtr)0x0) {
    ctxt_local = (xmlParserCtxtPtr)0x0;
  }
  else {
    xmlCtxtReset(ctxt);
    xmlCtxtUseOptions(ctxt,options);
    input_00 = xmlCtxtNewInputFromString(ctxt,URL,(char *)str,encoding,2);
    if (input_00 == (xmlParserInputPtr)0x0) {
      ctxt_local = (xmlParserCtxtPtr)0x0;
    }
    else {
      ctxt_local = (xmlParserCtxtPtr)xmlCtxtParseDocument(ctxt,input_00);
    }
  }
  return (xmlDocPtr)ctxt_local;
}

Assistant:

xmlDocPtr
xmlCtxtReadDoc(xmlParserCtxtPtr ctxt, const xmlChar *str,
               const char *URL, const char *encoding, int options)
{
    xmlParserInputPtr input;

    if (ctxt == NULL)
        return(NULL);

    xmlCtxtReset(ctxt);
    xmlCtxtUseOptions(ctxt, options);

    input = xmlCtxtNewInputFromString(ctxt, URL, (const char *) str, encoding,
                                      XML_INPUT_BUF_STATIC);
    if (input == NULL)
        return(NULL);

    return(xmlCtxtParseDocument(ctxt, input));
}